

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O3

bool AppInitServers(NodeContext *node)

{
  ArgsManager *this;
  bool bVar1;
  ArgsManager **ppAVar2;
  SignalInterrupt **ppSVar3;
  long in_FS_OFFSET;
  string local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  ppAVar2 = inline_assertion_check<true,ArgsManager*&>
                      (&node->args,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init.cpp"
                       ,0x2c7,"AppInitServers","node.args");
  this = *ppAVar2;
  ppSVar3 = inline_assertion_check<true,util::SignalInterrupt*&>
                      (&node->shutdown,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init.cpp"
                       ,0x2c8,"AppInitServers","node.shutdown");
  bVar1 = InitHTTPServer(*ppSVar3);
  if (bVar1) {
    StartRPC();
    std::function<void()>::operator=
              ((function<void()> *)&node->rpc_interruption_point,RpcInterruptionPoint);
    local_50._M_dataplus._M_p = (pointer)std::any::_Manager_internal<node::NodeContext_*>::_S_manage
    ;
    local_50._M_string_length = (size_type)node;
    bVar1 = StartHTTPRPC((any *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (*(code *)local_50._M_dataplus._M_p)(3,&local_50,0);
    }
    if (bVar1) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"-rest","");
      bVar1 = ArgsManager::GetBoolArg(this,&local_50,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (bVar1) {
        local_50._M_dataplus._M_p =
             (pointer)std::any::_Manager_internal<node::NodeContext_*>::_S_manage;
        local_50._M_string_length = (size_type)node;
        StartREST((any *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (*(code *)local_50._M_dataplus._M_p)(3,&local_50,0);
        }
      }
      StartHTTPServer();
      bVar1 = true;
      goto LAB_00186fe1;
    }
  }
  bVar1 = false;
LAB_00186fe1:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

static bool AppInitServers(NodeContext& node)
{
    const ArgsManager& args = *Assert(node.args);
    if (!InitHTTPServer(*Assert(node.shutdown))) {
        return false;
    }
    StartRPC();
    node.rpc_interruption_point = RpcInterruptionPoint;
    if (!StartHTTPRPC(&node))
        return false;
    if (args.GetBoolArg("-rest", DEFAULT_REST_ENABLE)) StartREST(&node);
    StartHTTPServer();
    return true;
}